

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void prepare_mask_shader(Uint32 shader,GPU_Image *image,GPU_Image *mask_image)

{
  int iVar1;
  
  if (image != (GPU_Image *)0x0) {
    iVar1 = GPU_GetUniformLocation(shader,"resolution_x");
    GPU_SetUniformf(iVar1,(float)image->w);
    iVar1 = GPU_GetUniformLocation(shader,"resolution_y");
    GPU_SetUniformf(iVar1,(float)image->h);
  }
  if (mask_image != (GPU_Image *)0x0) {
    iVar1 = GPU_GetUniformLocation(shader,"mask_resolution_x");
    GPU_SetUniformf(iVar1,(float)mask_image->w);
    iVar1 = GPU_GetUniformLocation(shader,"mask_resolution_y");
    GPU_SetUniformf(iVar1,(float)mask_image->h);
  }
  iVar1 = GPU_GetUniformLocation(shader,"offset_x");
  GPU_SetUniformf(iVar1,0.0);
  iVar1 = GPU_GetUniformLocation(shader,"offset_y");
  GPU_SetUniformf(iVar1,0.0);
  iVar1 = GPU_GetUniformLocation(shader,"mask_tex");
  GPU_SetShaderImage(mask_image,iVar1,1);
  return;
}

Assistant:

void prepare_mask_shader(Uint32 shader, GPU_Image* image, GPU_Image* mask_image)
{
    if(image != NULL)
    {
        GPU_SetUniformf(GPU_GetUniformLocation(shader, "resolution_x"), image->w);
        GPU_SetUniformf(GPU_GetUniformLocation(shader, "resolution_y"), image->h);
    }
    if(mask_image != NULL)
    {
        GPU_SetUniformf(GPU_GetUniformLocation(shader, "mask_resolution_x"), mask_image->w);
        GPU_SetUniformf(GPU_GetUniformLocation(shader, "mask_resolution_y"), mask_image->h);
    }
    
    GPU_SetUniformf(GPU_GetUniformLocation(shader, "offset_x"), 0.0f);
    GPU_SetUniformf(GPU_GetUniformLocation(shader, "offset_y"), 0.0f);
    
    GPU_SetShaderImage(mask_image, GPU_GetUniformLocation(shader, "mask_tex"), 1);
}